

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Liby::Buffer::append(Buffer *this,Buffer *that)

{
  char *buf;
  
  if (that->leftIndex_ == that->rightIndex_) {
    return;
  }
  buf = data(that);
  if (that->leftIndex_ <= that->rightIndex_) {
    append(this,buf,that->rightIndex_ - that->leftIndex_);
    return;
  }
  __assert_fail("rightIndex_ >= leftIndex_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                ,0x5a,"off_t Liby::Buffer::size() const");
}

Assistant:

bool Buffer::empty() const { return leftIndex_ == rightIndex_; }